

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  xmlChar *pxVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  byte bVar10;
  char *cur;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  bVar10 = (*str & 0xdfU) + 0xbf;
  iVar8 = 2;
  local_40 = (byte *)str;
  if (bVar10 < 0x1a) {
    pbVar9 = (byte *)(str + 1);
    iVar8 = (int)str;
    while( true ) {
      iVar8 = iVar8 + 1;
      bVar1 = *pbVar9;
      if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
         ((0x2e < bVar1 || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)))) break;
      pbVar9 = pbVar9 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      local_40 = (byte *)str;
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar6 = xmlStrndup(local_40,iVar8 - (int)local_40);
      uri->scheme = (char *)pxVar6;
    }
    iVar8 = 0;
    local_40 = pbVar9;
  }
  if ((bVar10 < 0x1a) && (iVar8 = 1, *local_40 == 0x3a)) {
    pbVar9 = local_40 + 1;
    bVar10 = local_40[1];
    local_48 = pbVar9;
    if (bVar10 == 0x2f) {
      if (local_40[2] != 0x2f) {
        local_40 = pbVar9;
        iVar8 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
        goto joined_r0x0018b4c1;
      }
      local_48 = local_40 + 3;
      local_40 = pbVar9;
      iVar8 = xmlParse3986Authority(uri,(char **)&local_48);
      if (iVar8 == 0) {
        if (uri->server == (char *)0x0) {
          uri->port = -1;
        }
        iVar4 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
        iVar8 = 1;
        if (iVar4 != 0) goto LAB_0018b4cf;
        goto LAB_0018b4c3;
      }
    }
    else {
      if ((9 < (byte)(bVar10 - 0x30)) && (0x19 < (byte)((bVar10 & 0xdf) + 0xbf))) {
        uVar5 = bVar10 - 0x21;
        if (uVar5 < 0x3f) {
          if ((0x4000000096003fe9U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            if ((ulong)uVar5 != 4) goto LAB_0018b481;
            if (((((byte)(local_40[2] - 0x30) < 10) ||
                 ((uVar7 = local_40[2] - 0x41, uVar7 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) &&
                (((byte)(local_40[3] - 0x30) < 10 ||
                 ((uVar7 = local_40[3] - 0x41, uVar7 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))))) ||
               ((uVar5 < 0x20 && ((0x96000fe9U >> (uVar5 & 0x1f) & 1) != 0)))) goto LAB_0018b35d;
            goto LAB_0018b48a;
          }
        }
        else {
LAB_0018b481:
          if (bVar10 != 0x7e) {
LAB_0018b48a:
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                local_40 = pbVar9;
                (*xmlFree)(uri->path);
              }
              uri->path = (char *)0x0;
            }
            goto LAB_0018b4c3;
          }
        }
      }
LAB_0018b35d:
      local_40 = pbVar9;
      local_38 = pbVar9;
      iVar8 = xmlParse3986Segment((char **)&local_38,'\0',0);
      if (iVar8 == 0) {
        do {
          pbVar3 = local_38;
          if (*local_38 != 0x2f) {
            iVar8 = (int)local_38;
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (pbVar3 == pbVar9) {
                pxVar6 = (xmlChar *)0x0;
              }
              else {
                iVar8 = iVar8 - (int)pbVar9;
                if ((uri->cleanup & 2) == 0) {
                  pxVar6 = (xmlChar *)xmlURIUnescapeString((char *)pbVar9,iVar8,(char *)0x0);
                }
                else {
                  pxVar6 = xmlStrndup(pbVar9,iVar8);
                }
              }
              uri->path = (char *)pxVar6;
            }
            iVar8 = 0;
            local_48 = pbVar3;
            break;
          }
          local_38 = local_38 + 1;
          iVar8 = 1;
          iVar4 = xmlParse3986Segment((char **)&local_38,'\0',1);
        } while (iVar4 == 0);
      }
joined_r0x0018b4c1:
      if (iVar8 == 0) {
LAB_0018b4c3:
        local_40 = local_48;
        iVar8 = 0;
      }
    }
LAB_0018b4cf:
    if (iVar8 == 0) {
      if (*local_40 == 0x3f) {
        local_40 = local_40 + 1;
        iVar8 = xmlParse3986Query(uri,(char **)&local_40);
        if (iVar8 != 0) goto LAB_0018b538;
      }
      if (*local_40 == 0x23) {
        local_40 = local_40 + 1;
        iVar8 = xmlParse3986Fragment(uri,(char **)&local_40);
        if (iVar8 != 0) goto LAB_0018b538;
      }
      if (*local_40 == 0) {
        iVar8 = 0;
      }
      else {
        xmlCleanURI(uri);
        iVar8 = 1;
      }
    }
  }
LAB_0018b538:
  if (iVar8 == 0) {
    return 0;
  }
  xmlCleanURI(uri);
  bVar10 = *str;
  local_48 = (byte *)str;
  if (bVar10 == 0x2f) {
    if (str[1] == '/') {
      local_48 = (byte *)(str + 2);
      iVar8 = xmlParse3986Authority(uri,(char **)&local_48);
      if (iVar8 != 0) goto LAB_0018b79f;
      iVar8 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
      iVar4 = iVar8;
    }
    else {
      iVar4 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
      iVar8 = 1;
    }
    if (iVar4 != 0) goto LAB_0018b79f;
  }
  else if (((byte)(bVar10 - 0x30) < 10) || ((byte)((bVar10 & 0xdf) + 0xbf) < 0x1a)) {
LAB_0018b5c5:
    bVar2 = false;
    local_38 = (byte *)str;
    iVar8 = xmlParse3986Segment((char **)&local_38,':',0);
    if (iVar8 == 0) {
      bVar2 = false;
      do {
        pbVar9 = local_38;
        if (*local_38 != 0x2f) {
          iVar8 = (int)local_38;
          if (uri != (xmlURIPtr)0x0) {
            if (uri->path != (char *)0x0) {
              (*xmlFree)(uri->path);
            }
            if (pbVar9 == local_48) {
              pxVar6 = (xmlChar *)0x0;
            }
            else {
              iVar8 = iVar8 - (int)local_48;
              if ((uri->cleanup & 2) == 0) {
                pxVar6 = (xmlChar *)xmlURIUnescapeString((char *)local_48,iVar8,(char *)0x0);
              }
              else {
                pxVar6 = xmlStrndup(local_48,iVar8);
              }
            }
            uri->path = (char *)pxVar6;
          }
          local_48 = pbVar9;
          iVar8 = 0;
          bVar2 = true;
          break;
        }
        local_38 = local_38 + 1;
        iVar8 = 1;
        iVar4 = xmlParse3986Segment((char **)&local_38,'\0',1);
      } while (iVar4 == 0);
    }
    else {
      iVar8 = 1;
    }
    if (!bVar2) goto LAB_0018b79f;
  }
  else {
    uVar5 = bVar10 - 0x21;
    if (uVar5 < 0x3f) {
      if ((0x4000000096003fe9U >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto LAB_0018b5c5;
      if ((ulong)uVar5 != 4) goto LAB_0018b6f9;
      if (((((byte)(str[1] - 0x30U) < 10) ||
           ((uVar7 = (byte)str[1] - 0x41, uVar7 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) &&
          (((byte)(str[2] - 0x30U) < 10 ||
           ((uVar7 = (byte)str[2] - 0x41, uVar7 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))))) ||
         ((uVar5 < 0x20 && ((0x96000fe9U >> (uVar5 & 0x1f) & 1) != 0)))) goto LAB_0018b5c5;
    }
    else {
LAB_0018b6f9:
      if (bVar10 == 0x7e) goto LAB_0018b5c5;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->path != (char *)0x0) {
        (*xmlFree)(uri->path);
      }
      uri->path = (char *)0x0;
    }
  }
  if (*local_48 == 0x3f) {
    local_48 = local_48 + 1;
    iVar4 = xmlParse3986Query(uri,(char **)&local_48);
    iVar8 = -1;
    if (iVar4 != 0) goto LAB_0018b79f;
  }
  if (*local_48 == 0x23) {
    local_48 = local_48 + 1;
    iVar4 = xmlParse3986Fragment(uri,(char **)&local_48);
    iVar8 = -1;
    if (iVar4 != 0) goto LAB_0018b79f;
  }
  if (*local_48 == 0) {
    iVar8 = 0;
  }
  else {
    xmlCleanURI(uri);
    iVar8 = 1;
  }
LAB_0018b79f:
  iVar4 = 0;
  if (iVar8 != 0) {
    xmlCleanURI(uri);
    iVar4 = iVar8;
  }
  return iVar4;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}